

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::ConeRecord1::Encode(ConeRecord1 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Loc,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32Height);
  KDataStream::Write<float>(stream,(float)this->m_f32PeakAngle);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  return;
}

Assistant:

void ConeRecord1::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << m_f32Height
           << m_f32PeakAngle
           << m_ui32Padding;
}